

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::instr<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *__x;
  int iVar1;
  undefined1 local_40 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  
  Lexer::peekKeyword((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_40,
                     &ctx->in);
  if ((keyword.
       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
       _M_payload._8_1_ != '\x01') ||
     ((((((local_40 != (undefined1  [8])0x3 ||
          (iVar1 = bcmp((void *)keyword.
                                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                ._M_payload._M_value._M_len,"end",3), iVar1 != 0)) &&
         ((local_40 != (undefined1  [8])0x4 ||
          (iVar1 = bcmp((void *)keyword.
                                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                ._M_payload._M_value._M_len,"then",4), iVar1 != 0)))) &&
        ((local_40 != (undefined1  [8])0x4 ||
         (iVar1 = bcmp((void *)keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._M_value._M_len,"else",4), iVar1 != 0)))) &&
       ((local_40 != (undefined1  [8])0x5 ||
        (iVar1 = bcmp((void *)keyword.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._M_payload._M_value._M_len,"catch",5), iVar1 != 0)))) &&
      ((((local_40 != (undefined1  [8])&DAT_00000009 ||
         (iVar1 = bcmp((void *)keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._M_value._M_len,"catch_all",9), iVar1 != 0)) &&
        ((local_40 != (undefined1  [8])&DAT_00000008 ||
         (iVar1 = bcmp((void *)keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._M_value._M_len,"delegate",8), iVar1 != 0)))) &&
       ((local_40 != (undefined1  [8])0x3 ||
        (iVar1 = bcmp((void *)keyword.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._M_payload._M_value._M_len,"ref",3), iVar1 != 0)))))))) {
    __x = &(ctx->in).annotations;
    std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
              ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40,__x);
    blockinstr<wasm::WATParser::ParseDeclsCtx>
              (__return_storage_ptr__,ctx,
               (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40);
    if (local_40 != (undefined1  [8])0x0) {
      operator_delete((void *)local_40,
                      CONCAT71(keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._9_7_,
                               keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._8_1_) - (long)local_40);
    }
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) != '\x01') {
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      __return_storage_ptr__);
    std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
              ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40,__x);
    plaininstr<wasm::WATParser::ParseDeclsCtx>
              (__return_storage_ptr__,ctx,
               (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40);
    if (local_40 != (undefined1  [8])0x0) {
      operator_delete((void *)local_40,
                      CONCAT71(keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._9_7_,
                               keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._8_1_) - (long)local_40);
    }
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) != '\x01') {
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      __return_storage_ptr__);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> instr(Ctx& ctx) {
  // Check for valid strings that are not instructions.
  if (auto keyword = ctx.in.peekKeyword()) {
    if (keyword == "end"sv || keyword == "then"sv || keyword == "else"sv ||
        keyword == "catch"sv || keyword == "catch_all"sv ||
        keyword == "delegate"sv || keyword == "ref"sv) {
      return {};
    }
  }
  if (auto inst = blockinstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  if (auto inst = plaininstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  // TODO: Handle folded plain instructions as well.
  return {};
}